

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::CheckTypeCompatibility
          (TPZSkylMatrix<double> *this,TPZMatrix<double> *A,TPZMatrix<double> *B)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  anon_class_1_0_00000001 incompatSkyline;
  anon_class_1_0_00000001 local_11;
  
  if (A == (TPZMatrix<double> *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(A,&TPZMatrix<double>::typeinfo,&typeinfo);
  }
  if (B == (TPZMatrix<double> *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(B,&TPZMatrix<double>::typeinfo,&typeinfo,0);
    if (lVar2 != 0 && lVar3 != 0) goto LAB_00d4daf7;
  }
  CheckTypeCompatibility::anon_class_1_0_00000001::operator()(&local_11);
LAB_00d4daf7:
  lVar5 = 0;
  lVar4 = *(long *)(lVar2 + 0x10);
  if (*(long *)(lVar2 + 0x10) < 1) {
    lVar4 = lVar5;
  }
  bVar6 = false;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    bVar1 = !bVar6;
    bVar6 = true;
    if (bVar1) {
      bVar6 = *(long *)(*(long *)(lVar2 + 0x28) + 8 + lVar5 * 8) -
              *(long *)(*(long *)(lVar2 + 0x28) + lVar5 * 8) !=
              *(long *)(*(long *)(lVar3 + 0x28) + 8 + lVar5 * 8) -
              *(long *)(*(long *)(lVar3 + 0x28) + lVar5 * 8);
    }
  }
  if (bVar6) {
    CheckTypeCompatibility::anon_class_1_0_00000001::operator()(&local_11);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::CheckTypeCompatibility(const TPZMatrix<TVar>*A,
                                                 const TPZMatrix<TVar>*B)const
{
  auto incompatSkyline = [](){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: incompatible matrices\n.Aborting...\n";
    DebugStop();
  };
  auto aPtr = dynamic_cast<const TPZSkylMatrix<TVar>*>(A);
  auto bPtr = dynamic_cast<const TPZSkylMatrix<TVar>*>(B);
  if(!aPtr || !bPtr){
    incompatSkyline();
  }

  bool check{false};
  auto ncols = aPtr->Cols();
  for(auto i = 0; i < ncols; i++){
    check = check || aPtr->Size(i) != bPtr->Size(i);
  }
  if(check) incompatSkyline();
}